

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O2

void __thiscall Region::AllocateEHBailoutData(Region *this,Func *func,Instr *tryInstr)

{
  RegionType RVar1;
  EHBailoutData *pEVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  EHBailoutData *pEVar6;
  undefined4 *puVar7;
  BranchInstr *pBVar8;
  
  RVar1 = this->type;
  pEVar6 = (EHBailoutData *)
           new<NativeCodeData::AllocatorT<Js::EHBailoutData>>
                     (0x20,(AllocatorT<Js::EHBailoutData> *)&func->topFunc->nativeCodeDataAllocator,
                      0x5af1ba);
  if (RVar1 == RegionTypeRoot) {
    pEVar6->nestingDepth = -1;
    pEVar6->catchOffset = 0;
    pEVar6->finallyOffset = 0;
    *(undefined8 *)&pEVar6->ht = 0;
    pEVar6->parent = (EHBailoutData *)0x0;
    pEVar6->child = (EHBailoutData *)0x0;
    this->ehBailoutData = pEVar6;
  }
  else {
    pEVar2 = this->parent->ehBailoutData;
    pEVar6->nestingDepth = pEVar2->nestingDepth + 1;
    pEVar6->catchOffset = 0;
    pEVar6->finallyOffset = 0;
    pEVar6->ht = HT_None;
    pEVar6->parent = pEVar2;
    pEVar6->child = (EHBailoutData *)0x0;
    this->ehBailoutData = pEVar6;
    if (this->type == RegionTypeCatch) {
      pEVar6->ht = HT_Catch;
    }
    else if (this->type == RegionTypeTry) {
      if (tryInstr == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Region.cpp"
                           ,0x22,"(tryInstr)","tryInstr");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      if (tryInstr->m_opcode == TryFinally) {
        pBVar8 = IR::Instr::AsBranchInstr(tryInstr);
        uVar5 = IR::Instr::GetByteCodeOffset(&pBVar8->m_branchTarget->super_Instr);
        this->ehBailoutData->finallyOffset = uVar5;
      }
      else if (tryInstr->m_opcode == TryCatch) {
        pBVar8 = IR::Instr::AsBranchInstr(tryInstr);
        uVar5 = IR::Instr::GetByteCodeOffset(&pBVar8->m_branchTarget->super_Instr);
        this->ehBailoutData->catchOffset = uVar5;
      }
    }
    else {
      pEVar6->ht = HT_Finally;
    }
  }
  return;
}

Assistant:

void
Region::AllocateEHBailoutData(Func * func, IR::Instr * tryInstr)
{
    if (this->GetType() == RegionTypeRoot)
    {
        this->ehBailoutData = NativeCodeDataNew(func->GetNativeCodeDataAllocator(), Js::EHBailoutData, -1 /*nestingDepth*/, 0 /*catchOffset*/, 0 /*finallyOffset*/, Js::HandlerType::HT_None, nullptr /*parent*/);
    }
    else
    {
        this->ehBailoutData = NativeCodeDataNew(func->GetNativeCodeDataAllocator(), Js::EHBailoutData, this->GetParent()->ehBailoutData->nestingDepth + 1, 0, 0, Js::HandlerType::HT_None, this->GetParent()->ehBailoutData);
        if (this->GetType() == RegionTypeTry)
        {
            Assert(tryInstr);
            if (tryInstr->m_opcode == Js::OpCode::TryCatch)
            {
                this->ehBailoutData->catchOffset = tryInstr->AsBranchInstr()->GetTarget()->GetByteCodeOffset(); // ByteCode offset of the Catch
            }
            else if (tryInstr->m_opcode == Js::OpCode::TryFinally)
            {
                this->ehBailoutData->finallyOffset = tryInstr->AsBranchInstr()->GetTarget()->GetByteCodeOffset(); // ByteCode offset of the Finally
            }
        }
        else if (this->GetType() == RegionTypeCatch)
        {
            this->ehBailoutData->ht = Js::HandlerType::HT_Catch;
        }
        else
        {
            this->ehBailoutData->ht = Js::HandlerType::HT_Finally;
        }
    }
}